

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIff.c
# Opt level: O0

Iff_Man_t *
Gia_ManIffPerform(Gia_Man_t *pGia,If_LibLut_t *pLib,Tim_Man_t *pTime,int nLutSize,int nDegree)

{
  long lVar1;
  Gia_Obj_t *p_00;
  Tim_Man_t *pTVar2;
  int iVar3;
  bool bVar4;
  float fVar5;
  float DelayMin;
  float Time;
  float local_64;
  float arrMax;
  float arrTime3;
  float arrTime2;
  float arrTime1;
  int Count3;
  int Count2;
  int CountAll;
  int iFanin2;
  int iFanin1;
  int iFanin;
  int iObj;
  Gia_Obj_t *pObj;
  Iff_Man_t *p;
  int nDegree_local;
  int nLutSize_local;
  Tim_Man_t *pTime_local;
  If_LibLut_t *pLib_local;
  Gia_Man_t *pGia_local;
  
  Count3 = 0;
  arrTime1 = 0.0;
  arrTime2 = 0.0;
  local_64 = -1e+09;
  p._0_4_ = nDegree;
  p._4_4_ = nLutSize;
  _nDegree_local = pTime;
  pTime_local = (Tim_Man_t *)pLib;
  pLib_local = (If_LibLut_t *)pGia;
  if ((nDegree != 2) && (nDegree != 3)) {
    __assert_fail("nDegree == 2 || nDegree == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIff.c"
                  ,0xe9,
                  "Iff_Man_t *Gia_ManIffPerform(Gia_Man_t *, If_LibLut_t *, Tim_Man_t *, int, int)")
    ;
  }
  pObj = (Gia_Obj_t *)Gia_ManIffStart(pGia);
  ((Iff_Man_t *)pObj)->pGia = (Gia_Man_t *)pLib_local;
  ((Iff_Man_t *)pObj)->pLib = (If_LibLut_t *)pTime_local;
  ((Iff_Man_t *)pObj)->nLutSize = p._4_4_;
  ((Iff_Man_t *)pObj)->nDegree = (int)p;
  Iff_ObjSetTimeId((Iff_Man_t *)pObj,0,0.0);
  Tim_ManIncrementTravId(_nDegree_local);
  iFanin1 = 1;
  while( true ) {
    bVar4 = false;
    if (iFanin1 < (int)pLib_local->pLutAreas[2]) {
      _iFanin = Gia_ManObj((Gia_Man_t *)pLib_local,iFanin1);
      bVar4 = _iFanin != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar3 = Gia_ObjIsAnd(_iFanin);
    if (iVar3 == 0) {
      iVar3 = Gia_ObjIsCi(_iFanin);
      pTVar2 = _nDegree_local;
      if (iVar3 == 0) {
        iVar3 = Gia_ObjIsCo(_iFanin);
        p_00 = pObj;
        if (iVar3 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIff.c"
                        ,0x125,
                        "Iff_Man_t *Gia_ManIffPerform(Gia_Man_t *, If_LibLut_t *, Tim_Man_t *, int, int)"
                       );
        }
        iVar3 = Gia_ObjFaninId0p((Gia_Man_t *)pLib_local,_iFanin);
        fVar5 = Iff_ObjTimeId((Iff_Man_t *)p_00,iVar3);
        pTVar2 = _nDegree_local;
        iVar3 = Gia_ObjCioId(_iFanin);
        Tim_ManSetCoArrival(pTVar2,iVar3,fVar5);
        Iff_ObjSetTime((Iff_Man_t *)pObj,_iFanin,fVar5);
        local_64 = Abc_MaxFloat(local_64,fVar5);
      }
      else {
        iVar3 = Gia_ObjCioId(_iFanin);
        fVar5 = Tim_ManGetCiArrival(pTVar2,iVar3);
        Iff_ObjSetTime((Iff_Man_t *)pObj,_iFanin,fVar5);
      }
    }
    else {
      iVar3 = Gia_ObjIsLut((Gia_Man_t *)pLib_local,iFanin1);
      if (iVar3 != 0) {
        Count3 = Count3 + 1;
        fVar5 = Gia_IffObjTimeOne((Iff_Man_t *)pObj,iFanin1,-1,-1);
        lVar1 = *(long *)&pObj->Value;
        iVar3 = Gia_ObjLutSize((Gia_Man_t *)pLib_local,iFanin1);
        fVar5 = *(float *)(lVar1 + 0x94 + (long)iVar3 * 0x84) + fVar5;
        DelayMin = Gia_IffObjTimeTwo((Iff_Man_t *)pObj,iFanin1,&iFanin2,fVar5);
        if ((int)p == 2) {
          Iff_ObjSetTimeId((Iff_Man_t *)pObj,iFanin1,DelayMin);
          if (DelayMin < fVar5) {
            Iff_ObjSetMatchId((Iff_Man_t *)pObj,iFanin1,2,iFanin2);
            arrTime1 = (float)((int)arrTime1 + 1);
          }
        }
        else {
          if ((int)p != 3) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIff.c"
                          ,0x117,
                          "Iff_Man_t *Gia_ManIffPerform(Gia_Man_t *, If_LibLut_t *, Tim_Man_t *, int, int)"
                         );
          }
          Time = Gia_IffObjTimeThree((Iff_Man_t *)pObj,iFanin1,&CountAll,&Count2,DelayMin);
          Iff_ObjSetTimeId((Iff_Man_t *)pObj,iFanin1,Time);
          if ((Time != fVar5) || (NAN(Time) || NAN(fVar5))) {
            if ((Time != DelayMin) || (NAN(Time) || NAN(DelayMin))) {
              if (DelayMin <= Time) {
                __assert_fail("arrTime3 < arrTime2",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIff.c"
                              ,0x112,
                              "Iff_Man_t *Gia_ManIffPerform(Gia_Man_t *, If_LibLut_t *, Tim_Man_t *, int, int)"
                             );
              }
              Iff_ObjSetMatchId((Iff_Man_t *)pObj,iFanin1,2,CountAll);
              Iff_ObjSetMatchId((Iff_Man_t *)pObj,iFanin1,3,Count2);
              arrTime2 = (float)((int)arrTime2 + 1);
            }
            else {
              Iff_ObjSetMatchId((Iff_Man_t *)pObj,iFanin1,2,iFanin2);
              arrTime1 = (float)((int)arrTime1 + 1);
            }
          }
        }
      }
    }
    iFanin1 = iFanin1 + 1;
  }
  printf("Max delay = %.2f.  Count1 = %d.  Count2 = %d.  Count3 = %d.\n",(double)local_64,
         (ulong)(uint)((Count3 - (int)arrTime1) - (int)arrTime2),(ulong)(uint)arrTime1,
         (ulong)(uint)arrTime2);
  return (Iff_Man_t *)pObj;
}

Assistant:

Iff_Man_t * Gia_ManIffPerform( Gia_Man_t * pGia, If_LibLut_t * pLib, Tim_Man_t * pTime, int nLutSize, int nDegree )
{
    Iff_Man_t * p;
    Gia_Obj_t * pObj;
    int iObj, iFanin, iFanin1, iFanin2;
    int CountAll = 0, Count2 = 0, Count3 = 0;
    float arrTime1, arrTime2, arrTime3, arrMax = -ABC_INFINITY; 
    assert( nDegree == 2 || nDegree == 3 );
    // start the mapping manager and set its parameters
    p = Gia_ManIffStart( pGia );
    p->pGia     = pGia;
    p->pLib     = pLib;
    p->nLutSize = nLutSize;
    p->nDegree  = nDegree;
    // compute arrival times of each node
    Iff_ObjSetTimeId( p, 0, 0 );
    Tim_ManIncrementTravId( pTime );
    Gia_ManForEachObj1( pGia, pObj, iObj )
    {
        if ( Gia_ObjIsAnd(pObj) )
        {
            if ( !Gia_ObjIsLut(pGia, iObj) )
                continue;
            CountAll++;
            // compute arrival times of LUT inputs
            arrTime1 = Gia_IffObjTimeOne( p, iObj, -1, -1 );
            arrTime1 += p->pLib->pLutDelays[Gia_ObjLutSize(pGia, iObj)][0];
            // compute arrival times of LUT pairs
            arrTime2 = Gia_IffObjTimeTwo( p, iObj, &iFanin, arrTime1 );
            if ( nDegree == 2 )
            {
                // set arrival times
                Iff_ObjSetTimeId( p, iObj, arrTime2 );
                if ( arrTime2 < arrTime1 )
                    Iff_ObjSetMatchId( p, iObj, 2, iFanin ), Count2++;                
            }
            else if ( nDegree == 3 )
            {                
                // compute arrival times of LUT triples
                arrTime3 = Gia_IffObjTimeThree( p, iObj, &iFanin1, &iFanin2, arrTime2 );
                // set arrival times
                Iff_ObjSetTimeId( p, iObj, arrTime3 );
                if ( arrTime3 == arrTime1 )
                    continue;
                if ( arrTime3 == arrTime2 )
                    Iff_ObjSetMatchId( p, iObj, 2, iFanin ), Count2++;
                else
                {
                    assert( arrTime3 < arrTime2 );
                    Iff_ObjSetMatchId( p, iObj, 2, iFanin1 );
                    Iff_ObjSetMatchId( p, iObj, 3, iFanin2 ), Count3++;
                }
            }
            else assert( 0 );
        }
        else if ( Gia_ObjIsCi(pObj) )
        {
            arrTime1 = Tim_ManGetCiArrival( pTime, Gia_ObjCioId(pObj) );
            Iff_ObjSetTime( p, pObj, arrTime1 );
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            arrTime1 = Iff_ObjTimeId( p, Gia_ObjFaninId0p(pGia, pObj) );
            Tim_ManSetCoArrival( pTime, Gia_ObjCioId(pObj), arrTime1 );
            Iff_ObjSetTime( p, pObj, arrTime1 );
            arrMax = Abc_MaxFloat( arrMax, arrTime1 );
        }
        else assert( 0 );
    }
    printf( "Max delay = %.2f.  Count1 = %d.  Count2 = %d.  Count3 = %d.\n", 
        arrMax, CountAll - Count2 - Count3, Count2, Count3 );
    return p;
}